

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHCurlNoGrads.cpp
# Opt level: O0

void TPZShapeHCurlNoGrads<pzshape::TPZShapeTetra>::Shape
               (TPZVec<double> *pt,TPZShapeData *data,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *curlphi)

{
  int iVar1;
  int *piVar2;
  double *pdVar3;
  int64_t iVar4;
  long in_RSI;
  double dVar5;
  int x_3;
  int x_2;
  int fi;
  int ifunc;
  int64_t newfuncs;
  TPZVec<int> filtVecShape;
  int x_1;
  int x;
  int fss;
  int ie;
  int fcount;
  TPZFMatrix<double> curlphi_unfilt;
  TPZFMatrix<double> phi_unfilt;
  int i;
  int n_unfilt;
  TPZManVector<int,_11> first_hcurl_side;
  TPZManVector<int,_27> *connectorders;
  int nedges;
  int curldim;
  int dim;
  int ncon;
  int nsides;
  int ncorner;
  TPZManVector<int,_11> *in_stack_fffffffffffffd20;
  double *in_stack_fffffffffffffd30;
  _func_int **in_stack_fffffffffffffd38;
  TPZFMatrix<double> *in_stack_fffffffffffffd40;
  int64_t in_stack_fffffffffffffd48;
  TPZManVector<int,_11> *in_stack_fffffffffffffd50;
  int64_t in_stack_fffffffffffffd58;
  TPZFMatrix<double> *in_stack_fffffffffffffd60;
  TPZFMatrix<double> *in_stack_fffffffffffffd88;
  TPZFMatrix<double> *in_stack_fffffffffffffd90;
  TPZShapeData *in_stack_fffffffffffffd98;
  TPZVec<double> *in_stack_fffffffffffffda0;
  int local_218;
  int local_214;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  TPZVec<int> *in_stack_fffffffffffffdf8;
  TPZVec<int> *in_stack_fffffffffffffe00;
  int local_1dc;
  int local_1d8;
  int local_1d0;
  int local_a8;
  int local_98;
  TPZVec<int> local_90 [2];
  TPZVec<int> *local_40;
  int local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  long local_10;
  
  local_24 = 4;
  local_28 = 0xf;
  local_2c = 0xb;
  local_30 = 3;
  local_34 = 3;
  local_10 = in_RSI;
  local_38 = pztopology::TPZTetrahedron::NumSides(0x18d4418);
  local_40 = (TPZVec<int> *)(local_10 + 0x2b50);
  TPZManVector<int,_11>::TPZManVector
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,(int *)in_stack_fffffffffffffd40);
  TPZVec<int>::operator[](local_40,0);
  local_98 = TPZShapeHCurl<pzshape::TPZShapeTetra>::ComputeNConnectShapeF
                       ((int)in_stack_fffffffffffffd50,
                        (int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
  for (local_a8 = 1; local_a8 < 0xb; local_a8 = local_a8 + 1) {
    piVar2 = TPZVec<int>::operator[](local_90,(long)local_a8);
    *piVar2 = local_98;
    TPZVec<int>::operator[](local_40,(long)local_a8);
    iVar1 = TPZShapeHCurl<pzshape::TPZShapeTetra>::ComputeNConnectShapeF
                      ((int)in_stack_fffffffffffffd50,
                       (int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
    local_98 = iVar1 + local_98;
  }
  TPZFMatrix<double>::TPZFMatrix
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,(int64_t)in_stack_fffffffffffffd50)
  ;
  TPZFMatrix<double>::TPZFMatrix
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,(int64_t)in_stack_fffffffffffffd50)
  ;
  TPZShapeHCurl<pzshape::TPZShapeTetra>::Shape
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
             in_stack_fffffffffffffd88);
  for (local_1d0 = 0; local_1d0 < local_38; local_1d0 = local_1d0 + 1) {
    TPZVec<int>::operator[](local_90,(long)local_1d0);
    for (local_1d8 = 0; local_1d8 < 3; local_1d8 = local_1d8 + 1) {
      pdVar3 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                          (int64_t)in_stack_fffffffffffffd30);
      dVar5 = *pdVar3;
      pdVar3 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                          (int64_t)in_stack_fffffffffffffd30);
      dVar5 = dVar5 + *pdVar3;
      pdVar3 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                          (int64_t)in_stack_fffffffffffffd30);
      *pdVar3 = dVar5;
    }
    for (local_1dc = 0; local_1dc < 3; local_1dc = local_1dc + 1) {
      pdVar3 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                          (int64_t)in_stack_fffffffffffffd30);
      dVar5 = *pdVar3;
      pdVar3 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                          (int64_t)in_stack_fffffffffffffd30);
      dVar5 = dVar5 + *pdVar3;
      pdVar3 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                          (int64_t)in_stack_fffffffffffffd30);
      *pdVar3 = dVar5;
    }
  }
  TPZVec<int>::TPZVec((TPZVec<int> *)&stack0xfffffffffffffe00);
  HighOrderFunctionsFilter
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
             (TPZVec<int> *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  iVar4 = TPZVec<int>::size((TPZVec<int> *)&stack0xfffffffffffffe00);
  for (iVar1 = 0; iVar1 < iVar4; iVar1 = iVar1 + 1) {
    TPZVec<int>::operator[]((TPZVec<int> *)&stack0xfffffffffffffe00,(long)iVar1);
    for (local_214 = 0; local_214 < 3; local_214 = local_214 + 1) {
      pdVar3 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                          (int64_t)in_stack_fffffffffffffd30);
      in_stack_fffffffffffffd38 = (_func_int **)*pdVar3;
      in_stack_fffffffffffffd40 =
           (TPZFMatrix<double> *)
           TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                      (int64_t)in_stack_fffffffffffffd30);
      (in_stack_fffffffffffffd40->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable = in_stack_fffffffffffffd38;
    }
    for (local_218 = 0; local_218 < 3; local_218 = local_218 + 1) {
      in_stack_fffffffffffffd30 =
           TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                      (int64_t)in_stack_fffffffffffffd30);
      in_stack_fffffffffffffd20 = (TPZManVector<int,_11> *)*in_stack_fffffffffffffd30;
      pdVar3 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                          (int64_t)in_stack_fffffffffffffd30);
      *pdVar3 = (double)in_stack_fffffffffffffd20;
    }
  }
  TPZVec<int>::~TPZVec(&in_stack_fffffffffffffd20->super_TPZVec<int>);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x18d4a88);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x18d4a95);
  TPZManVector<int,_11>::~TPZManVector(in_stack_fffffffffffffd20);
  return;
}

Assistant:

void TPZShapeHCurlNoGrads<TSHAPE>::Shape(TPZVec<REAL> &pt, TPZShapeData &data, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &curlphi)
{

    constexpr int ncorner = TSHAPE::NCornerNodes;
    constexpr int nsides = TSHAPE::NSides;
    constexpr int ncon = nsides - ncorner;
    constexpr int dim = TSHAPE::Dimension;
    constexpr int curldim = [dim](){
        if constexpr (dim == 1) return 1;
        else{
            return 2*dim - 3;//1 for 2D 3 for 3D
        }
    }();
    const int nedges = TSHAPE::NumSides(1);
    
    //calculates # of unfiltered hcurl functions
    const auto &connectorders = data.fHDivConnectOrders;
    //first_hcurl_side[i] is the index of the first shape function associated with side i
    TPZManVector<int,ncon> first_hcurl_side(ncon,0);
    //total number of unfiltered funcs
    int n_unfilt = 0;

    {
      n_unfilt += TPZShapeHCurl<TSHAPE>::ComputeNConnectShapeF(0,connectorders[0]);
      for (int i = 1; i < ncon; i++){
        first_hcurl_side[i] = n_unfilt;
        n_unfilt += TPZShapeHCurl<TSHAPE>::ComputeNConnectShapeF(i,connectorders[i]);
      }
    }
    
    //computes  unfiltered hcurl funcs
    TPZFMatrix<REAL> phi_unfilt(dim,n_unfilt), curlphi_unfilt(curldim,n_unfilt);
    TPZShapeHCurl<TSHAPE>::Shape(pt, data, phi_unfilt, curlphi_unfilt);

    //now we filter the functions
    int fcount = 0;
    //edges: we sum the lowest order functions on the edge
    for(auto ie = 0; ie < nedges; ie++){
      //fss = first side shape
      const auto fss = first_hcurl_side[ie];
      for(auto x = 0; x < dim; x++){
        phi(x,fcount) = phi_unfilt(x,fss) + phi_unfilt(x,fss+1);
      }
      for(auto x = 0; x < curldim; x++){
        curlphi(x,fcount) = curlphi_unfilt(x,fss) + curlphi_unfilt(x,fss+1);
      }
      fcount++;
    }
    if constexpr (dim < 2) return;

    TPZVec<int> filtVecShape;
    HighOrderFunctionsFilter(first_hcurl_side, connectorders,filtVecShape);

    const auto newfuncs = filtVecShape.size();
    
    for(int ifunc = 0; ifunc < newfuncs; ifunc++){
      const auto fi = filtVecShape[ifunc];
      for(auto x = 0; x < curldim; x++){
        curlphi(x,fcount) = curlphi_unfilt(x,fi);
      }
      for(auto x = 0; x < dim; x++){
        phi(x,fcount) = phi_unfilt(x,fi);
      }
      fcount++;
    } 
    
    
}